

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V0LayerParameter::SharedDtor(V0LayerParameter *this)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value;
  V0LayerParameter *pVVar2;
  V0LayerParameter *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->name_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->type_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->source_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->meanfile_,psVar1);
  default_value =
       google::protobuf::internal::
       ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)_default_det_crop_mode__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->det_crop_mode_,default_value);
  pVVar2 = internal_default_instance();
  if ((this != pVVar2) && (this->weight_filler_ != (FillerParameter *)0x0)) {
    (*(this->weight_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar2 = internal_default_instance();
  if ((this != pVVar2) && (this->bias_filler_ != (FillerParameter *)0x0)) {
    (*(this->bias_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pVVar2 = internal_default_instance();
  if ((this != pVVar2) && (this->hdf5_output_param_ != (HDF5OutputParameter *)0x0)) {
    (*(this->hdf5_output_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void V0LayerParameter::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  source_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  meanfile_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  det_crop_mode_.DestroyNoArena(&V0LayerParameter::_default_det_crop_mode_.get());
  if (this != internal_default_instance()) {
    delete weight_filler_;
  }
  if (this != internal_default_instance()) {
    delete bias_filler_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_output_param_;
  }
}